

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint64_t helper_fixb(CPUS390XState_conflict *env,uint64_t ah,uint64_t al,uint32_t m34)

{
  byte bVar1;
  _Bool XxC;
  int old_mode_00;
  float128 fVar2;
  uintptr_t unaff_retaddr;
  uint64_t local_38;
  float128 ret;
  int old_mode;
  uint32_t m34_local;
  uint64_t al_local;
  uint64_t ah_local;
  CPUS390XState_conflict *env_local;
  
  bVar1 = round_from_m34(m34);
  old_mode_00 = s390_swap_bfp_rounding_mode(env,(uint)bVar1);
  fVar2.high = ah;
  fVar2.low = al;
  fVar2 = float128_round_to_int_s390x(fVar2,&env->fpu_status);
  s390_restore_bfp_rounding_mode(env,old_mode_00);
  XxC = xxc_from_m34(m34);
  handle_exceptions(env,XxC,unaff_retaddr);
  local_38 = fVar2.low;
  env->retxl = local_38;
  ret.low = fVar2.high;
  return ret.low;
}

Assistant:

uint64_t HELPER(fixb)(CPUS390XState *env, uint64_t ah, uint64_t al,
                      uint32_t m34)
{
    int old_mode = s390_swap_bfp_rounding_mode(env, round_from_m34(m34));
    float128 ret = float128_round_to_int(make_float128(ah, al),
                                         &env->fpu_status);

    s390_restore_bfp_rounding_mode(env, old_mode);
    handle_exceptions(env, xxc_from_m34(m34), GETPC());
    return RET128(ret);
}